

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytable.hpp
# Opt level: O0

int to_func_keys_index(uint keycode)

{
  undefined4 local_c;
  uint keycode_local;
  
  if (keycode == 1) {
    local_c = 0;
  }
  else if ((keycode < 0xe) || (0xf < keycode)) {
    if ((keycode < 0x1c) || (0x1d < keycode)) {
      if (keycode == 0x2a) {
        local_c = 5;
      }
      else if ((keycode < 0x36) || (0x53 < keycode)) {
        if ((keycode < 0x57) || (0x58 < keycode)) {
          if ((keycode < 0x60) || (0x6f < keycode)) {
            if (keycode == 0x77) {
              local_c = 0x36;
            }
            else if ((keycode < 0x7d) || (0x7f < keycode)) {
              local_c = -1;
            }
            else {
              local_c = keycode - 0x46;
            }
          }
          else {
            local_c = keycode - 0x3a;
          }
        }
        else {
          local_c = keycode - 0x33;
        }
      }
      else {
        local_c = keycode - 0x30;
      }
    }
    else {
      local_c = keycode - 0x19;
    }
  }
  else {
    local_c = keycode - 0xd;
  }
  return local_c;
}

Assistant:

inline int to_func_keys_index(unsigned int keycode)
{
  if (keycode == KEY_ESC)               // 1
    return 0;
  if (keycode >= KEY_BACKSPACE && keycode <= KEY_TAB)               // 14-15
    return keycode - 13;
  if (keycode >= KEY_ENTER && keycode <= KEY_LEFTCTRL)               // 28-29
    return keycode - 25;
  if (keycode == KEY_LEFTSHIFT) return keycode - 37;                // 42
  if (keycode >= KEY_RIGHTSHIFT && keycode <= KEY_KPDOT)               // 54-83
    return keycode - 48;
  if (keycode >= KEY_F11 && keycode <= KEY_F12)               // 87-88
    return keycode - 51;
  if (keycode >= KEY_KPENTER && keycode <= KEY_DELETE)               // 96-111
    return keycode - 58;
  if (keycode == KEY_PAUSE)               // 119
    return keycode - 65;
  if (keycode >= KEY_LEFTMETA && keycode <= KEY_COMPOSE)               // 125-127
    return keycode - 70;

  return -1;               // not function key keycode
}